

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryBuilder::readDataSegments(WasmBinaryBuilder *this)

{
  pointer pcVar1;
  pointer pcVar2;
  __uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> _Var3;
  bool bVar4;
  uint32_t uVar5;
  vector<wasm::Name*,std::allocator<wasm::Name*>> *this_00;
  Expression *pEVar6;
  undefined8 in_RCX;
  size_t i;
  string_view sVar7;
  string_view sVar8;
  IString IVar9;
  Name memory;
  Name name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong local_78;
  map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
  *local_70;
  string local_68;
  key_type local_3c;
  _Head_base<0UL,_wasm::DataSegment_*,_false> _Stack_38;
  Index memIdx;
  
  bVar4 = isDebugEnabled("binary");
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"== readDataSegments\n",0x14);
  }
  uVar5 = getU32LEB(this);
  if (uVar5 != 0) {
    local_78 = (ulong)uVar5;
    local_70 = &this->memoryRefs;
    i = 0;
    do {
      bVar4 = SUB81(in_RCX,0);
      sVar7 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xbd4a1c),bVar4);
      memory.super_IString.str._M_len = sVar7._M_str;
      sVar8 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xbd4a1c),bVar4);
      memory.super_IString.str._M_str = (char *)sVar8._M_len;
      name.super_IString.str._M_str = (char *)sVar7._M_len;
      name.super_IString.str._M_len = (size_t)&stack0xffffffffffffffc8;
      Builder::makeDataSegment
                (name,memory,sVar8._M_str._0_1_,(Expression *)0x0,(char *)0x0,(Address)0xbd4a1c);
      uVar5 = getU32LEB(this);
      _Var3._M_t.
      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
      super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
           (tuple<wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>)
           (tuple<wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>)
           _Stack_38._M_head_impl;
      if (2 < uVar5) {
        std::__cxx11::to_string(&local_68,uVar5);
        std::operator+(&local_98,"bad segment flags, must be 0, 1, or 2, not ",&local_68);
        throwError(this,&local_98);
      }
      IVar9.str = (string_view)Name::fromInt(i);
      *(string_view *)
       _Var3._M_t.
       super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
       super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl = IVar9.str;
      *(bool *)((long)_Var3._M_t.
                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x10) =
           false;
      (_Stack_38._M_head_impl)->isPassive = (bool)((byte)uVar5 & 1);
      if ((uVar5 & 1) == 0) {
        local_3c = 0;
        if (uVar5 == 2) {
          local_3c = getU32LEB(this);
        }
        this_00 = (vector<wasm::Name*,std::allocator<wasm::Name*>> *)
                  std::
                  map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
                  ::operator[](local_70,&local_3c);
        local_68._M_dataplus._M_p = (pointer)&(_Stack_38._M_head_impl)->memory;
        std::vector<wasm::Name*,std::allocator<wasm::Name*>>::emplace_back<wasm::Name*>
                  (this_00,(Name **)&local_68);
        pEVar6 = readExpression(this);
        *(Expression **)((long)_Stack_38._M_head_impl + 0x30) = pEVar6;
      }
      else {
        ((_Stack_38._M_head_impl)->memory).super_IString.str._M_len = 0;
        ((_Stack_38._M_head_impl)->memory).super_IString.str._M_str = (char *)0x0;
        (_Stack_38._M_head_impl)->offset = (Expression *)0x0;
      }
      uVar5 = getU32LEB(this);
      sVar7 = getByteView(this,(ulong)uVar5);
      std::vector<char,std::allocator<char>>::vector<char_const*,void>
                ((vector<char,std::allocator<char>> *)&local_68,sVar7._M_str,
                 sVar7._M_str + sVar7._M_len,(allocator_type *)&local_3c);
      in_RCX = local_68.field_2._M_allocated_capacity;
      pcVar1 = ((_Stack_38._M_head_impl)->data).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pcVar2 = ((_Stack_38._M_head_impl)->data).super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      ((_Stack_38._M_head_impl)->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = local_68._M_dataplus._M_p;
      ((_Stack_38._M_head_impl)->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_68._M_string_length;
      ((_Stack_38._M_head_impl)->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_68.field_2._M_allocated_capacity;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      if (pcVar1 != (pointer)0x0) {
        operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1);
        if ((Name *)local_68._M_dataplus._M_p != (Name *)0x0) {
          operator_delete(local_68._M_dataplus._M_p,
                          local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
        }
      }
      Module::addDataSegment
                (this->wasm,
                 (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                 &stack0xffffffffffffffc8);
      if ((_Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>)
          _Stack_38._M_head_impl != (DataSegment *)0x0) {
        std::default_delete<wasm::DataSegment>::operator()
                  ((default_delete<wasm::DataSegment> *)&stack0xffffffffffffffc8,
                   _Stack_38._M_head_impl);
      }
      i = i + 1;
    } while (local_78 != i);
  }
  return;
}

Assistant:

void WasmBinaryBuilder::readDataSegments() {
  BYN_TRACE("== readDataSegments\n");
  auto num = getU32LEB();
  for (size_t i = 0; i < num; i++) {
    auto curr = Builder::makeDataSegment();
    uint32_t flags = getU32LEB();
    if (flags > 2) {
      throwError("bad segment flags, must be 0, 1, or 2, not " +
                 std::to_string(flags));
    }
    curr->setName(Name::fromInt(i), false);
    curr->isPassive = flags & BinaryConsts::IsPassive;
    if (curr->isPassive) {
      curr->memory = Name();
      curr->offset = nullptr;
    } else {
      Index memIdx = 0;
      if (flags & BinaryConsts::HasIndex) {
        memIdx = getU32LEB();
      }
      memoryRefs[memIdx].push_back(&curr->memory);
      curr->offset = readExpression();
    }
    auto size = getU32LEB();
    auto data = getByteView(size);
    curr->data = {data.begin(), data.end()};
    wasm.addDataSegment(std::move(curr));
  }
}